

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_flechette.cpp
# Opt level: O2

int AF_A_CheckThrowBomb2(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  double *pdVar1;
  byte *pbVar2;
  VM_UBYTE VVar3;
  DObject *this;
  bool bVar4;
  long lVar5;
  char *__assertion;
  AActor *this_00;
  double dVar6;
  VMValue params [3];
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053b2e2;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0053b176:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar4 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar4) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053b2e2;
        }
      }
      if (numparam == 1) goto LAB_0053b1f7;
      VVar3 = param[1].field_0.field_3.Type;
      if (VVar3 != 0xff) {
        if (VVar3 != '\x03') goto LAB_0053b2d2;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar4 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar4) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053b2e2;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053b2d2;
      }
      if ((((uint)numparam < 3) || (VVar3 = param[2].field_0.field_3.Type, VVar3 == 0xff)) ||
         ((VVar3 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053b1f7:
        pdVar1 = &(this_00->Vel).Z;
        if (*pdVar1 <= 2.0 && *pdVar1 != 2.0) {
          dVar6 = TVector3<double>::LengthSquared(&this_00->Vel);
          if (dVar6 < 2.25) {
            AActor::SetState(this_00,this_00->SpawnState + 6,false);
            (this_00->__Pos).Z = this_00->floorz;
            (this_00->Vel).Z = 0.0;
            (this_00->BounceFlags).Value = 0;
            pbVar2 = (byte *)((long)&(this_00->flags).Value + 2);
            *pbVar2 = *pbVar2 & 0xfe;
          }
        }
        params[0].field_0._8_4_ = 1;
        params[0].field_0.field_3.Type = '\x03';
        params[1].field_0.field_3.Type = '\x03';
        params[2].field_0.field_1.a = (void *)0x0;
        params[2].field_0.field_1.atag = 8;
        params[2].field_0.field_3.Type = '\x03';
        params[0].field_0._0_8_ = this_00;
        params[1].field_0._0_8_ = this_00;
        params[1].field_0._8_4_ = params[0].field_0._8_4_;
        VMFrameStack::Call(stack,&A_CheckThrowBomb_VMPtr->super_VMFunction,params,3,(VMReturn *)0x0,
                           0,(VMException **)0x0);
        lVar5 = 0x20;
        do {
          VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar5));
          lVar5 = lVar5 + -0x10;
        } while (lVar5 != -0x10);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053b2e2;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0053b176;
  }
LAB_0053b2d2:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053b2e2:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_flechette.cpp"
                ,0x1ba,"int AF_A_CheckThrowBomb2(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CheckThrowBomb2)
{
	PARAM_ACTION_PROLOGUE;

	// [RH] Check using actual velocity, although the vel.z < 2 check still stands
	if (self->Vel.Z < 2 && self->Vel.LengthSquared() < (9./4.))
	{
		self->SetState (self->SpawnState + 6);
		self->SetZ(self->floorz);
		self->Vel.Z = 0;
		self->BounceFlags = BOUNCE_None;
		self->flags &= ~MF_MISSILE;
	}
	CALL_ACTION(A_CheckThrowBomb, self);
	return 0;
}